

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall ev3dev::remote_control::~remote_control(remote_control *this)

{
  sensor *this_00;
  
  this->_vptr_remote_control = (_func_int **)&PTR__remote_control_00125cd8;
  if (this->_owns_sensor == true) {
    this_00 = &this->_sensor->super_sensor;
    if (this_00 != (sensor *)0x0) {
      sensor::~sensor(this_00);
    }
    operator_delete(this_00);
  }
  std::_Function_base::~_Function_base(&(this->on_state_change).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_beacon).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_blue_down).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_blue_up).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_red_down).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_red_up).super__Function_base);
  return;
}

Assistant:

remote_control::~remote_control() {
    if (_owns_sensor)
        delete _sensor;
}